

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

SimpleString StringFrom(double value,int precision)

{
  int iVar1;
  uint in_ESI;
  SimpleString *in_RDI;
  char *in_XMM0_Qa;
  SimpleString *this;
  
  this = in_RDI;
  iVar1 = (*PlatformSpecificIsNan)((double)in_XMM0_Qa);
  if (iVar1 == 0) {
    iVar1 = (*PlatformSpecificIsInf)((double)in_XMM0_Qa);
    if (iVar1 == 0) {
      StringFromFormat(in_XMM0_Qa,in_RDI,"%.*g",(ulong)in_ESI);
    }
    else {
      SimpleString::SimpleString(this,(char *)in_RDI);
    }
  }
  else {
    SimpleString::SimpleString(this,(char *)in_RDI);
  }
  return (SimpleString)(char *)this;
}

Assistant:

SimpleString StringFrom(double value, int precision)
{
    if (PlatformSpecificIsNan(value))
        return "Nan - Not a number";
    else if (PlatformSpecificIsInf(value))
        return "Inf - Infinity";
    else
        return StringFromFormat("%.*g", precision, value);
}